

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int acttab_insert(acttab *p)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  lookahead_action *plVar8;
  ulong uVar9;
  lookahead_action lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  lookahead_action *plVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  
  if (p->nLookahead < 1) {
    __assert_fail("p->nLookahead>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0x231,"int acttab_insert(acttab *)");
  }
  iVar5 = p->nAction + p->mxLookahead + 1;
  uVar1 = p->nActionAlloc;
  if ((int)uVar1 <= iVar5) {
    iVar5 = iVar5 + uVar1 + 0x14;
    p->nActionAlloc = iVar5;
    plVar14 = p->aAction;
    plVar8 = (lookahead_action *)realloc(plVar14,(long)iVar5 << 3);
    p->aAction = plVar8;
    if (plVar8 == (lookahead_action *)0x0) {
      acttab_insert_cold_1();
      lVar10 = plVar14[1];
      do {
        if (lVar10 == (lookahead_action)0x0) {
          return 0;
        }
        if ((*(long *)((long)lVar10 + 0x58) == 0) && (0 < (long)*(int *)((long)lVar10 + 0x18))) {
          lVar11 = *(long *)((long)lVar10 + 0x58);
          lVar12 = 0;
          do {
            if (lVar11 != 0) break;
            lVar2 = *(long *)(*(long *)((long)lVar10 + 0x20) + lVar12 * 8);
            if (*(int *)(lVar2 + 0xc) == 2) {
              if (0 < (long)*(int *)(lVar2 + 0x54)) {
                lVar17 = 0;
                do {
                  lVar3 = *(long *)(*(long *)(lVar2 + 0x58) + lVar17 * 8);
                  if (-1 < *(int *)(lVar3 + 0x20)) goto LAB_00103e00;
                  lVar17 = lVar17 + 1;
                } while (*(int *)(lVar2 + 0x54) != lVar17);
              }
            }
            else {
              lVar3 = lVar2;
              if (-1 < *(int *)(lVar2 + 0x20)) {
LAB_00103e00:
                lVar11 = lVar3;
                *(long *)((long)lVar10 + 0x58) = lVar11;
              }
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != *(int *)((long)lVar10 + 0x18));
        }
        lVar10 = *(lookahead_action *)((long)lVar10 + 0x78);
      } while( true );
    }
    if ((int)uVar1 < p->nActionAlloc) {
      memset(plVar8 + (int)uVar1,0xff,(ulong)(p->nActionAlloc + ~uVar1) * 8 + 8);
    }
  }
  uVar1 = p->nAction;
  uVar6 = uVar1 - 1;
  if ((int)uVar1 < 1) {
    bVar4 = true;
  }
  else {
    plVar14 = p->aAction;
    iVar5 = p->mnLookahead;
    iVar15 = iVar5 - uVar1;
    uVar16 = (ulong)uVar1;
    uVar9 = (ulong)uVar6;
    do {
      iVar15 = iVar15 + 1;
      iVar13 = (int)uVar16;
      if ((plVar14[uVar9].lookahead == iVar5) && (plVar14[uVar9].action == p->mnAction)) {
        uVar16 = (ulong)p->nLookahead;
        bVar4 = 0 < (long)uVar16;
        if (0 < (long)uVar16) {
          plVar8 = p->aLookahead;
          iVar18 = plVar8->lookahead;
          uVar6 = (iVar18 - iVar5) + (int)uVar9;
          if (uVar6 < uVar1) {
            uVar19 = 1;
            do {
              if ((iVar18 != plVar14[uVar6].lookahead) ||
                 (plVar8[uVar19 - 1].action != plVar14[uVar6].action)) break;
              if (uVar16 == uVar19) goto LAB_00103c1f;
              bVar4 = uVar19 < uVar16;
              iVar18 = plVar8[uVar19].lookahead;
              uVar6 = (iVar18 - iVar5) + (int)uVar9;
              uVar19 = uVar19 + 1;
            } while (uVar6 < uVar1);
          }
          if (bVar4) goto LAB_00103c51;
        }
LAB_00103c1f:
        uVar16 = 0;
        iVar18 = 0;
        do {
          iVar18 = iVar18 + (uint)(iVar15 + (int)uVar16 == plVar14[uVar16].lookahead &&
                                  -1 < plVar14[uVar16].lookahead);
          uVar16 = uVar16 + 1;
        } while (uVar1 != uVar16);
        if (iVar18 == p->nLookahead) goto LAB_00103c6d;
      }
LAB_00103c51:
      uVar16 = uVar9 & 0xffffffff;
      bVar4 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar4);
    uVar9 = 0xffffffff;
    iVar13 = 0;
LAB_00103c6d:
    uVar6 = (uint)uVar9;
    bVar4 = iVar13 < 1;
  }
  if (bVar4) {
    uVar7 = p->nActionAlloc - p->mxLookahead;
    if (uVar7 == 0 || p->nActionAlloc < p->mxLookahead) {
      uVar6 = 0;
    }
    else {
      plVar14 = p->aAction;
      iVar5 = 0;
      uVar9 = 0;
      do {
        if (plVar14[uVar9].lookahead < 0) {
          uVar16 = (ulong)p->nLookahead;
          bVar4 = 0 < (long)uVar16;
          uVar6 = (uint)uVar9;
          if (0 < (long)uVar16) {
            uVar20 = (p->aLookahead->lookahead - p->mnLookahead) + uVar6;
            if (-1 < (int)uVar20) {
              uVar19 = 1;
              do {
                if (-1 < plVar14[uVar20].lookahead) break;
                if (uVar16 == uVar19) goto LAB_00103ce9;
                bVar4 = uVar19 < uVar16;
                plVar8 = p->aLookahead + uVar19;
                uVar19 = uVar19 + 1;
                uVar20 = (plVar8->lookahead - p->mnLookahead) + uVar6;
              } while (-1 < (int)uVar20);
            }
            if (bVar4) goto LAB_00103d16;
          }
LAB_00103ce9:
          if ((int)uVar1 < 1) {
            uVar16 = 0;
          }
          else {
            uVar16 = 0;
            do {
              if (p->mnLookahead + iVar5 + (int)uVar16 == plVar14[uVar16].lookahead)
              goto LAB_00103d11;
              uVar16 = uVar16 + 1;
            } while (uVar1 != uVar16);
            uVar16 = (ulong)uVar1;
          }
LAB_00103d11:
          if ((uint)uVar16 == uVar1) break;
        }
LAB_00103d16:
        uVar9 = uVar9 + 1;
        iVar5 = iVar5 + -1;
        uVar6 = uVar7;
      } while (uVar9 != uVar7);
    }
  }
  if (0 < p->nLookahead) {
    lVar11 = 0;
    do {
      iVar5 = (p->aLookahead[lVar11].lookahead - p->mnLookahead) + uVar6;
      p->aAction[iVar5] = p->aLookahead[lVar11];
      if (p->nAction <= iVar5) {
        p->nAction = iVar5 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < p->nLookahead);
  }
  p->nLookahead = 0;
  return uVar6 - p->mnLookahead;
}

Assistant:

int acttab_insert(acttab *p){
  int i, j, k, n;
  assert( p->nLookahead>0 );

  /* Make sure we have enough space to hold the expanded action table
  ** in the worst case.  The worst case occurs if the transaction set
  ** must be appended to the current action table
  */
  n = p->mxLookahead + 1;
  if( p->nAction + n >= p->nActionAlloc ){
    int oldAlloc = p->nActionAlloc;
    p->nActionAlloc = p->nAction + n + p->nActionAlloc + 20;
    p->aAction = (struct lookahead_action *) realloc( p->aAction,
                          sizeof(p->aAction[0])*p->nActionAlloc);
    if( p->aAction==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
    for(i=oldAlloc; i<p->nActionAlloc; i++){
      p->aAction[i].lookahead = -1;
      p->aAction[i].action = -1;
    }
  }

  /* Scan the existing action table looking for an offset that is a 
  ** duplicate of the current transaction set.  Fall out of the loop
  ** if and when the duplicate is found.
  **
  ** i is the index in p->aAction[] where p->mnLookahead is inserted.
  */
  for(i=p->nAction-1; i>=0; i--){
    if( p->aAction[i].lookahead==p->mnLookahead ){
      /* All lookaheads and actions in the aLookahead[] transaction
      ** must match against the candidate aAction[i] entry. */
      if( p->aAction[i].action!=p->mnAction ) continue;
      for(j=0; j<p->nLookahead; j++){
        k = p->aLookahead[j].lookahead - p->mnLookahead + i;
        if( k<0 || k>=p->nAction ) break;
        if( p->aLookahead[j].lookahead!=p->aAction[k].lookahead ) break;
        if( p->aLookahead[j].action!=p->aAction[k].action ) break;
      }
      if( j<p->nLookahead ) continue;

      /* No possible lookahead value that is not in the aLookahead[]
      ** transaction is allowed to match aAction[i] */
      n = 0;
      for(j=0; j<p->nAction; j++){
        if( p->aAction[j].lookahead<0 ) continue;
        if( p->aAction[j].lookahead==j+p->mnLookahead-i ) n++;
      }
      if( n==p->nLookahead ){
        break;  /* An exact match is found at offset i */
      }
    }
  }

  /* If no existing offsets exactly match the current transaction, find an
  ** an empty offset in the aAction[] table in which we can add the
  ** aLookahead[] transaction.
  */
  if( i<0 ){
    /* Look for holes in the aAction[] table that fit the current
    ** aLookahead[] transaction.  Leave i set to the offset of the hole.
    ** If no holes are found, i is left at p->nAction, which means the
    ** transaction will be appended. */
    for(i=0; i<p->nActionAlloc - p->mxLookahead; i++){
      if( p->aAction[i].lookahead<0 ){
        for(j=0; j<p->nLookahead; j++){
          k = p->aLookahead[j].lookahead - p->mnLookahead + i;
          if( k<0 ) break;
          if( p->aAction[k].lookahead>=0 ) break;
        }
        if( j<p->nLookahead ) continue;
        for(j=0; j<p->nAction; j++){
          if( p->aAction[j].lookahead==j+p->mnLookahead-i ) break;
        }
        if( j==p->nAction ){
          break;  /* Fits in empty slots */
        }
      }
    }
  }
  /* Insert transaction set at index i. */
  for(j=0; j<p->nLookahead; j++){
    k = p->aLookahead[j].lookahead - p->mnLookahead + i;
    p->aAction[k] = p->aLookahead[j];
    if( k>=p->nAction ) p->nAction = k+1;
  }
  p->nLookahead = 0;

  /* Return the offset that is added to the lookahead in order to get the
  ** index into yy_action of the action */
  return i - p->mnLookahead;
}